

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O2

int __thiscall Poller::Process(Poller *this)

{
  EventContext *pEVar1;
  epoll_event *peVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pEVar1 = this->context;
  uVar4 = epoll_wait(pEVar1->epollfd,(epoll_event *)pEVar1->events,pEVar1->nevents,pEVar1->timeout);
  uVar7 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar5 * 0xc - uVar7 == 0) {
      return 0;
    }
    peVar2 = this->context->events;
    uVar4 = *(uint *)((long)&peVar2->events + uVar7);
    plVar3 = *(long **)((long)&peVar2->data + uVar7);
    lVar6 = 0x28;
    if ((uVar4 & 0x18) == 0) {
      if ((uVar4 & 1) != 0) {
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
      lVar6 = 0x20;
      if ((uVar4 & 4) != 0) goto LAB_001048db;
    }
    else {
LAB_001048db:
      (**(code **)(*plVar3 + lVar6))(plVar3);
    }
    uVar7 = uVar7 + 0xc;
  } while( true );
}

Assistant:

int Poller::Process() {
    int fds = epoll_wait(context->epollfd, context->events, context->nevents, context->timeout);
    for(int i = 0; i < fds; ++i) {
        auto& event = context->events[i];
        auto what = event.events;
        auto* po = (PollObj*)(event.data.ptr);
        if (what & (EPOLLHUP | EPOLLERR)) {
            po->OnError();
        }
        else {
            if(what & EPOLLIN)
                po->OnData();
            if(what & EPOLLOUT)
                po->OnWrite();
        }
    }
    return 0;
}